

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomon.cpp
# Opt level: O2

void __thiscall iomon::iomon(iomon *this)

{
  _Rb_tree_header *p_Var1;
  pointer ppVar2;
  long lVar3;
  pointer ppVar4;
  initializer_list<prmon::parameter> __l;
  allocator_type local_3d4;
  allocator local_3d3;
  allocator local_3d2;
  allocator local_3d1;
  allocator local_3d0;
  allocator local_3cf;
  allocator local_3ce;
  allocator local_3cd;
  allocator local_3cc;
  allocator local_3cb;
  allocator local_3ca;
  allocator local_3c9;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
  *local_3c8;
  parameter_list *local_3c0;
  iomon *local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  undefined1 local_210 [192];
  parameter local_150;
  parameter local_f0;
  parameter local_90;
  
  (this->super_MessageBase).logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->super_MessageBase).logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Imonitor)._vptr_Imonitor = (_func_int **)&PTR__iomon_001db530;
  std::__cxx11::string::string((string *)&local_230,"rchar",(allocator *)&local_3b0);
  std::__cxx11::string::string((string *)&local_250,"B",&local_3c9);
  std::__cxx11::string::string((string *)&local_270,"B/s",&local_3ca);
  prmon::parameter::parameter((parameter *)local_210,&local_230,&local_250,&local_270);
  std::__cxx11::string::string((string *)&local_290,"wchar",&local_3cb);
  std::__cxx11::string::string((string *)&local_2b0,"B",&local_3cc);
  std::__cxx11::string::string((string *)&local_2d0,"B/s",&local_3cd);
  prmon::parameter::parameter((parameter *)(local_210 + 0x60),&local_290,&local_2b0,&local_2d0);
  std::__cxx11::string::string((string *)&local_2f0,"read_bytes",&local_3ce);
  std::__cxx11::string::string((string *)&local_310,"B",&local_3cf);
  std::__cxx11::string::string((string *)&local_330,"B/s",&local_3d0);
  prmon::parameter::parameter(&local_150,&local_2f0,&local_310,&local_330);
  std::__cxx11::string::string((string *)&local_350,"write_bytes",&local_3d1);
  std::__cxx11::string::string((string *)&local_370,"B",&local_3d2);
  std::__cxx11::string::string((string *)&local_390,"B/s",&local_3d3);
  prmon::parameter::parameter(&local_f0,&local_350,&local_370,&local_390);
  __l._M_len = 4;
  __l._M_array = (iterator)local_210;
  std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::vector
            (&this->params,__l,&local_3d4);
  lVar3 = 0x120;
  do {
    prmon::parameter::~parameter((parameter *)(local_210 + lVar3));
    lVar3 = lVar3 + -0x60;
  } while (lVar3 != -0x60);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  local_3c8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
               *)&this->io_stats;
  p_Var1 = &(this->io_stats)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->io_stats)._M_t._M_impl = 0;
  *(undefined8 *)&(this->io_stats)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->io_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->io_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->io_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->io_stats)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c0 = &this->params;
  local_3b8 = this;
  std::__cxx11::string::string((string *)local_210,"iomon",(allocator *)&local_3b0);
  MessageBase::log_init(&this->super_MessageBase,(string *)local_210,&global_logging_level);
  std::__cxx11::string::~string((string *)local_210);
  ppVar2 = (this->params).super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (this->params).
                super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>._M_impl.
                super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1) {
    std::__cxx11::string::string((string *)&local_3b0,(string *)ppVar4);
    prmon::parameter::parameter(&local_90,ppVar4);
    prmon::monitored_value::monitored_value((monitored_value *)local_210,&local_90,true,0);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
    ::_M_emplace_unique<std::__cxx11::string_const,prmon::monitored_value>
              (local_3c8,&local_3b0,(monitored_value *)local_210);
    prmon::parameter::~parameter((parameter *)local_210);
    prmon::parameter::~parameter(&local_90);
    std::__cxx11::string::~string((string *)&local_3b0);
  }
  return;
}

Assistant:

iomon::iomon() : io_stats{} {
  log_init(MONITOR_NAME);
#undef MONITOR_NAME
  for (const auto& param : params) {
    io_stats.emplace(param.get_name(), prmon::monitored_value(param, true));
  }
}